

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_ws_emit(ws_session_t *session,uint32_t payload_len,char *payload,uchar op)

{
  char *__dest;
  undefined1 local_80 [24];
  undefined1 local_68;
  uchar local_67;
  undefined1 local_66;
  ulong local_60;
  undefined1 auStack_58 [8];
  void *local_50;
  undefined8 local_48;
  undefined8 local_40;
  void *local_38;
  char *payload_copy;
  nh_ws_out_context_t *ctx;
  char *pcStack_20;
  uchar op_local;
  char *payload_local;
  ws_session_t *pwStack_10;
  uint32_t payload_len_local;
  ws_session_t *session_local;
  
  if ((session->flags & 2) == 0) {
    ctx._7_1_ = op;
    pcStack_20 = payload;
    payload_local._4_4_ = payload_len;
    pwStack_10 = session;
    payload_copy = (char *)malloc(0x48);
    local_38 = malloc((ulong)payload_local._4_4_);
    memcpy(local_38,pcStack_20,(ulong)payload_local._4_4_);
    __dest = payload_copy;
    memset(local_80,0,0x18);
    local_68 = 0;
    local_67 = ctx._7_1_;
    local_66 = 0;
    local_60 = (ulong)payload_local._4_4_;
    memset(auStack_58,0,4);
    local_50 = local_38;
    local_48 = 0;
    local_40 = 0;
    memcpy(__dest,local_80,0x48);
    nh_stream_init((nh_stream_t *)payload_copy);
    nh_ws_generate_emit_stream((nh_ws_out_context_t *)payload_copy);
    if (pwStack_10->incomplete_emit == (nh_ws_out_context_t *)0x0) {
      pwStack_10->incomplete_emit_tail = (nh_ws_out_context_t *)payload_copy;
      pwStack_10->incomplete_emit = (nh_ws_out_context_t *)payload_copy;
      nh_ws_emit_handler(pwStack_10);
    }
    else {
      pwStack_10->incomplete_emit_tail->next = (nh_ws_out_context_t *)payload_copy;
      pwStack_10->incomplete_emit_tail = (nh_ws_out_context_t *)payload_copy;
    }
  }
  return;
}

Assistant:

void nh_ws_emit(ws_session_t *session, uint32_t payload_len, char const payload[payload_len], unsigned char op) {
    if (FLAG_CHECK(session->flags, WEBSOCKET_SESSION_CLOSE)) return;
    nh_ws_out_context_t *ctx = malloc(sizeof(nh_ws_out_context_t));
    // copy payload
    char *payload_copy = malloc(sizeof(char) * payload_len);
    memcpy(payload_copy, payload, payload_len);
    *ctx = (nh_ws_out_context_t) {
        .frame = (nh_ws_frame) {
            .payload_length = payload_len,
            .payload = payload_copy,
            .opcode = op,
        },
        .stream = {0},
        .next = NULL,
    };
    nh_stream_init(&ctx->stream);
    nh_ws_generate_emit_stream(ctx);
    if (session->incomplete_emit != NULL) {
        // append to emit queue
        session->incomplete_emit_tail->next = ctx;
        session->incomplete_emit_tail = ctx;
        return;
    } else {
        session->incomplete_emit = session->incomplete_emit_tail = ctx;
    }
    nh_ws_emit_handler(session);
}